

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfNoLock(MapFieldBase *this)

{
  MapFieldBase *this_local;
  
  if (this->repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    this_local = (MapFieldBase *)0x0;
  }
  else {
    this_local = (MapFieldBase *)
                 RepeatedPtrField<google::protobuf::Message>::SpaceUsedExcludingSelfLong
                           (this->repeated_field_);
  }
  return (size_t)this_local;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfNoLock() const {
  if (repeated_field_ != nullptr) {
    return repeated_field_->SpaceUsedExcludingSelfLong();
  } else {
    return 0;
  }
}